

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

int __thiscall Fl_Help_View::handle(Fl_Help_View *this,int event)

{
  char cVar1;
  int iVar2;
  Fl_Help_Link *pFVar3;
  int iVar4;
  Fl_Cursor c;
  int yy;
  
  if (0xb < event - 1U) goto switchD_001b7301_caseD_8;
  iVar4 = (Fl::e_x - (this->super_Fl_Group).super_Fl_Widget.x_) + this->leftline_;
  yy = (Fl::e_y - (this->super_Fl_Group).super_Fl_Widget.y_) + this->topline_;
  switch(event) {
  case 1:
    iVar2 = Fl_Group::handle(&this->super_Fl_Group,1);
    if (iVar2 != 0) {
      return 1;
    }
    handle::linkp = find_link(this,iVar4,yy);
    if (handle::linkp != (Fl_Help_Link *)0x0) {
LAB_001b73ef:
      c = FL_CURSOR_HAND;
      goto LAB_001b749e;
    }
    cVar1 = begin_selection(this);
    if (cVar1 != '\0') {
LAB_001b7495:
      c = FL_CURSOR_INSERT;
      goto LAB_001b749e;
    }
    break;
  case 2:
    if (handle::linkp != (Fl_Help_Link *)0x0) {
      if (Fl::e_is_click != 0) {
        follow_link(this,handle::linkp);
      }
      fl_cursor(FL_CURSOR_DEFAULT);
      handle::linkp = (Fl_Help_Link *)0x0;
      return 1;
    }
    if (current_view != this) {
      return 1;
    }
    if (selection_push_last == 0) {
      return 1;
    }
    iVar4 = 0;
LAB_001b74bb:
    end_selection(this,iVar4);
    return 1;
  case 3:
    Fl_Group::handle(&this->super_Fl_Group,3);
    return 1;
  case 4:
    fl_cursor(FL_CURSOR_DEFAULT);
  default:
switchD_001b7301_caseD_8:
    iVar4 = Fl_Group::handle(&this->super_Fl_Group,event);
    return iVar4;
  case 5:
    if (handle::linkp == (Fl_Help_Link *)0x0) {
      if ((current_view == this) && (selection_push_last != 0)) {
        cVar1 = extend_selection(this);
        if (cVar1 != '\0') {
          Fl_Widget::redraw((Fl_Widget *)this);
        }
        goto LAB_001b7495;
      }
    }
    else if (Fl::e_is_click != 0) goto LAB_001b73ef;
    break;
  case 6:
    goto switchD_001b7301_caseD_6;
  case 7:
    if (current_view == this) {
      clear_global_selection(this);
    }
    goto switchD_001b7301_caseD_6;
  case 0xb:
    pFVar3 = find_link(this,iVar4,yy);
    if (pFVar3 != (Fl_Help_Link *)0x0) goto LAB_001b73ef;
    break;
  case 0xc:
    if ((Fl::e_state & 0x4d0000U) == 0x40000) {
      if ((Fl::e_keysym == 0x78) || (Fl::e_keysym == 99)) {
        iVar4 = 1;
        goto LAB_001b74bb;
      }
      if (Fl::e_keysym == 0x61) {
        select_all(this);
        goto switchD_001b7301_caseD_6;
      }
    }
    goto switchD_001b7301_caseD_8;
  }
  c = FL_CURSOR_DEFAULT;
LAB_001b749e:
  fl_cursor(c);
  return 1;
switchD_001b7301_caseD_6:
  Fl_Widget::redraw((Fl_Widget *)this);
  return 1;
}

Assistant:

int				// O - 1 if we handled it, 0 otherwise
Fl_Help_View::handle(int event)	// I - Event to handle
{
  static Fl_Help_Link *linkp;   // currently clicked link

  int xx = Fl::event_x() - x() + leftline_;
  int yy = Fl::event_y() - y() + topline_;

  switch (event)
  {
    case FL_FOCUS:
      redraw();
      return 1;
    case FL_UNFOCUS:
      clear_selection();
      redraw();
      return 1;
    case FL_ENTER :
      Fl_Group::handle(event);
      return 1;
    case FL_LEAVE :
      fl_cursor(FL_CURSOR_DEFAULT);
      break;
    case FL_MOVE:
      if (find_link(xx, yy)) fl_cursor(FL_CURSOR_HAND);
      else fl_cursor(FL_CURSOR_DEFAULT);
      return 1;
    case FL_PUSH:
      if (Fl_Group::handle(event)) return 1;
      linkp = find_link(xx, yy);
      if (linkp) {
        fl_cursor(FL_CURSOR_HAND);
        return 1;
      }
      if (begin_selection()) {
        fl_cursor(FL_CURSOR_INSERT);
        return 1;
      }
      fl_cursor(FL_CURSOR_DEFAULT);
      return 1;
    case FL_DRAG:
      if (linkp) {
        if (Fl::event_is_click()) {
          fl_cursor(FL_CURSOR_HAND);
        } else {
          fl_cursor(FL_CURSOR_DEFAULT); // should be "FL_CURSOR_CANCEL" if we had it
        }
        return 1;
      }
      if (current_view==this && selection_push_last) {
        if (extend_selection()) redraw();
        fl_cursor(FL_CURSOR_INSERT);
        return 1;
      }
      fl_cursor(FL_CURSOR_DEFAULT);
      return 1;
    case FL_RELEASE:
      if (linkp) {
        if (Fl::event_is_click()) {
          follow_link(linkp);
        }
        fl_cursor(FL_CURSOR_DEFAULT);
        linkp = 0;
        return 1;
      }
      if (current_view==this && selection_push_last) {
        end_selection();
        return 1;
      }
      return 1;
    case FL_SHORTCUT: {
      int mods = Fl::event_state() & (FL_META|FL_CTRL|FL_ALT|FL_SHIFT);
      if ( mods == FL_COMMAND) {
	switch ( Fl::event_key() ) {
	  case 'a': select_all(); redraw(); return 1;
	  case 'c':
	  case 'x': end_selection(1); return 1;
	}
      }
      break; }
  }
  return (Fl_Group::handle(event));
}